

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O2

ULONGLONG ConvertBytesToInteger_5(LPBYTE ValueAsBytes)

{
  return (ulong)(ushort)(*(ushort *)(ValueAsBytes + 3) << 8 | *(ushort *)(ValueAsBytes + 3) >> 8) |
         ((ulong)ValueAsBytes[2] | (ulong)((uint)ValueAsBytes[1] << 8 | (uint)*ValueAsBytes << 0x10)
         ) << 0x10;
}

Assistant:

ULONGLONG ConvertBytesToInteger_5(LPBYTE ValueAsBytes)
{
    ULONGLONG Value = 0;

    Value = (Value << 0x08) | ValueAsBytes[0];
    Value = (Value << 0x08) | ValueAsBytes[1];
    Value = (Value << 0x08) | ValueAsBytes[2];
    Value = (Value << 0x08) | ValueAsBytes[3];
    Value = (Value << 0x08) | ValueAsBytes[4];

    return Value;
}